

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

void __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::GetCellUnionBound
          (S2ShapeIndexRegion<S2ShapeIndex> *this,
          vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids)

{
  pointer pSVar1;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Var2;
  char cVar3;
  int iVar4;
  S2CellId SVar5;
  S2CellId SVar6;
  ulong uVar7;
  S2CellId SVar8;
  S2CellId last_index_id;
  S2CellId local_38;
  
  pSVar1 = (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_finish != pSVar1) {
    (cell_ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve(cell_ids,6);
  (**(code **)((long)((this->iter_->iter_)._M_t.
                      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->
                     _vptr_IteratorBase + 0x18))();
  cVar3 = (**(code **)((long)((this->iter_->iter_)._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                             _M_head_impl)->_vptr_IteratorBase + 0x28))();
  if (cVar3 != '\0') {
    _Var2._M_head_impl =
         (this->iter_->iter_)._M_t.
         super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
    SVar5.id_ = ((_Var2._M_head_impl)->id_).id_;
    last_index_id.id_ = SVar5.id_;
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_IteratorBase + 0x10))();
    SVar6.id_ = (((this->iter_->iter_)._M_t.
                  super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                  .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).
                id_;
    SVar8.id_ = SVar5.id_;
    if (SVar6.id_ != SVar5.id_) {
      local_38.id_ = SVar6.id_;
      iVar4 = S2CellId::GetCommonAncestorLevel(&local_38,SVar5);
      SVar5 = S2CellId::parent(&last_index_id,iVar4 + 1);
      local_38.id_ = (((this->iter_->iter_)._M_t.
                       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->
                     id_).id_;
      for (SVar6 = S2CellId::parent(&local_38,iVar4 + 1); SVar6.id_ != SVar5.id_;
          SVar6.id_ = SVar6.id_ + (-SVar6.id_ & SVar6.id_) * 2) {
        uVar7 = SVar6.id_ - 1 | SVar6.id_;
        _Var2._M_head_impl =
             (this->iter_->iter_)._M_t.
             super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
             .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
        SVar8.id_ = ((_Var2._M_head_impl)->id_).id_;
        if (SVar8.id_ <= uVar7) {
          (**(code **)((long)(_Var2._M_head_impl)->_vptr_IteratorBase + 0x30))
                    (_Var2._M_head_impl,uVar7 + (-uVar7 & uVar7) * 2);
          (**(code **)((long)((this->iter_->iter_)._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                             _M_head_impl)->_vptr_IteratorBase + 0x28))();
          CoverRange(SVar8,(S2CellId)
                           (((this->iter_->iter_)._M_t.
                             super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                             .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                            _M_head_impl)->id_).id_,cell_ids);
          (**(code **)((long)((this->iter_->iter_)._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                             _M_head_impl)->_vptr_IteratorBase + 0x20))();
        }
      }
      SVar5.id_ = (((this->iter_->iter_)._M_t.
                    super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).
                  id_;
      SVar8.id_ = last_index_id.id_;
    }
    CoverRange(SVar5,SVar8,cell_ids);
  }
  return;
}

Assistant:

void S2ShapeIndexRegion<IndexType>::GetCellUnionBound(
    std::vector<S2CellId> *cell_ids) const {
  // We find the range of S2Cells spanned by the index and choose a level such
  // that the entire index can be covered with just a few cells.  There are
  // two cases:
  //
  //  - If the index intersects two or more faces, then for each intersected
  //    face we add one cell to the covering.  Rather than adding the entire
  //    face, instead we add the smallest S2Cell that covers the S2ShapeIndex
  //    cells within that face.
  //
  //  - If the index intersects only one face, then we first find the smallest
  //    cell S that contains the index cells (just like the case above).
  //    However rather than using the cell S itself, instead we repeat this
  //    process for each of its child cells.  In other words, for each
  //    child cell C we add the smallest S2Cell C' that covers the index cells
  //    within C.  This extra step is relatively cheap and produces much
  //    tighter coverings when the S2ShapeIndex consists of a small region
  //    near the center of a large S2Cell.
  //
  // The following code uses only a single Iterator object because creating an
  // Iterator may be relatively expensive for some S2ShapeIndex types (e.g.,
  // it may involve memory allocation).
  cell_ids->clear();
  cell_ids->reserve(6);

  // Find the last S2CellId in the index.
  iter_.Finish();
  if (!iter_.Prev()) return;  // Empty index.
  const S2CellId last_index_id = iter_.id();
  iter_.Begin();
  if (iter_.id() != last_index_id) {
    // The index has at least two cells.  Choose an S2CellId level such that
    // the entire index can be spanned with at most 6 cells (if the index
    // spans multiple faces) or 4 cells (it the index spans a single face).
    int level = iter_.id().GetCommonAncestorLevel(last_index_id) + 1;

    // For each cell C at the chosen level, we compute the smallest S2Cell
    // that covers the S2ShapeIndex cells within C.
    const S2CellId last_id = last_index_id.parent(level);
    for (auto id = iter_.id().parent(level); id != last_id; id = id.next()) {
      // If the cell C does not contain any index cells, then skip it.
      if (id.range_max() < iter_.id()) continue;

      // Find the range of index cells contained by C and then shrink C so
      // that it just covers those cells.
      S2CellId first = iter_.id();
      iter_.Seek(id.range_max().next());
      iter_.Prev();
      CoverRange(first, iter_.id(), cell_ids);
      iter_.Next();
    }
  }
  CoverRange(iter_.id(), last_index_id, cell_ids);
}